

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_hostcache_prune(Curl_easy *data)

{
  bool bVar1;
  time_t now_00;
  time_t tVar2;
  size_t sVar3;
  time_t oldest;
  int timeout;
  time_t now;
  Curl_easy *data_local;
  
  oldest._4_4_ = (data->set).dns_cache_timeout;
  if ((data->dns).hostcache != (Curl_hash *)0x0) {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    now_00 = time((time_t *)0x0);
    do {
      tVar2 = hostcache_prune((data->dns).hostcache,oldest._4_4_,now_00);
      if (tVar2 < 0x7fffffff) {
        oldest._4_4_ = (int)tVar2;
      }
      else {
        oldest._4_4_ = 0x7ffffffe;
      }
      bVar1 = false;
      if (oldest._4_4_ != 0) {
        sVar3 = Curl_hash_count((data->dns).hostcache);
        bVar1 = 29999 < sVar3;
      }
    } while (bVar1);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
  }
  return;
}

Assistant:

void Curl_hostcache_prune(struct Curl_easy *data)
{
  time_t now;
  /* the timeout may be set -1 (forever) */
  int timeout = data->set.dns_cache_timeout;

  if(!data->dns.hostcache)
    /* NULL hostcache means we cannot do it */
    return;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  now = time(NULL);

  do {
    /* Remove outdated and unused entries from the hostcache */
    time_t oldest = hostcache_prune(data->dns.hostcache, timeout, now);

    if(oldest < INT_MAX)
      timeout = (int)oldest; /* we know it fits */
    else
      timeout = INT_MAX - 1;

    /* if the cache size is still too big, use the oldest age as new
       prune limit */
  } while(timeout &&
          (Curl_hash_count(data->dns.hostcache) > MAX_DNS_CACHE_SIZE));

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}